

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_rotate.c
# Opt level: O2

gdImagePtr gdImageRotate90(gdImagePtr src,int ignoretransparent)

{
  int iVar1;
  int color;
  gdImagePtr to;
  int x;
  code *pcVar2;
  int iVar3;
  int iVar4;
  
  if (src->trueColor == 0) {
    pcVar2 = gdImageGetPixel;
  }
  else {
    pcVar2 = gdImageGetTrueColorPixel;
  }
  to = gdImageCreateTrueColor(src->sy,src->sx);
  if (to != (gdImagePtr)0x0) {
    iVar1 = to->alphaBlendingFlag;
    to->alphaBlendingFlag = 0;
    to->transparent = src->transparent;
    gdImagePaletteCopy(to,src);
    for (x = 0; x < src->sy; x = x + 1) {
      iVar3 = -1;
      for (iVar4 = 0; iVar4 < src->sx; iVar4 = iVar4 + 1) {
        color = (*pcVar2)(src,iVar4,x);
        if (src->trueColor == 0) {
          color = src->green[color] * 0x100 + src->red[color] * 0x10000 + src->blue[color] +
                  src->alpha[color] * 0x1000000;
        }
        gdImageSetPixel(to,x,to->sy + iVar3,color);
        iVar3 = iVar3 + -1;
      }
    }
    to->alphaBlendingFlag = iVar1;
  }
  return to;
}

Assistant:

gdImagePtr gdImageRotate90 (gdImagePtr src, int ignoretransparent)
{
	int uY, uX;
	int c,r,g,b,a;
	gdImagePtr dst;
	FuncPtr f;

	if (src->trueColor) {
		f = gdImageGetTrueColorPixel;
	} else {
		f = gdImageGetPixel;
	}
	dst = gdImageCreateTrueColor(src->sy, src->sx);
	if (dst != NULL) {
		int old_blendmode = dst->alphaBlendingFlag;
		dst->alphaBlendingFlag = 0;

		dst->transparent = src->transparent;

		gdImagePaletteCopy (dst, src);

		for (uY = 0; uY<src->sy; uY++) {
			for (uX = 0; uX<src->sx; uX++) {
				c = f (src, uX, uY);
				if (!src->trueColor) {
					r = gdImageRed(src,c);
					g = gdImageGreen(src,c);
					b = gdImageBlue(src,c);
					a = gdImageAlpha(src,c);
					c = gdTrueColorAlpha(r, g, b, a);
				}
				if (ignoretransparent && c == dst->transparent) {
					gdImageSetPixel(dst, uY, (dst->sy - uX - 1), dst->transparent);
				} else {
					gdImageSetPixel(dst, uY, (dst->sy - uX - 1), c);
				}
			}
		}
		dst->alphaBlendingFlag = old_blendmode;
	}

	return dst;
}